

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O3

bool __thiscall
GmmLib::GmmTextureCalc::RedescribeTexturePlanes
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t *pWidthBytesPhysical)

{
  uint32_t uVar1;
  uint8_t uVar2;
  bool bVar3;
  GMM_PLATFORM_INFO *pGVar4;
  uint uVar5;
  long in_FS_OFFSET;
  GMM_TEXTURE_INFO local_238;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pGVar4 = GmmGetPlatformInfo(this->pGmmLibContext);
  memcpy(&local_238,pTexInfo,0x208);
  uVar2 = GmmIsUVPacked(pTexInfo->Format);
  uVar1 = local_238.BitsPerPixel;
  if (uVar2 != '\0') {
    bVar3 = false;
    uVar5 = pTexInfo->Format - GMM_FORMAT_NV12;
    if (0x23 < uVar5) goto LAB_001ac1fa;
    if ((0x800000038U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
      uVar1 = 0x10;
      if ((0x43UL >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_001ac1fa;
    }
    else {
      uVar1 = 0x20;
    }
  }
  local_238.BitsPerPixel = uVar1;
  SetTileMode(this,&local_238);
  uVar1 = pGVar4->TileInfo[local_238.TileMode].LogicalTileWidth;
  *pWidthBytesPhysical = -uVar1 & (*pWidthBytesPhysical - 1) + uVar1;
  bVar3 = true;
LAB_001ac1fa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool GmmLib::GmmTextureCalc::RedescribeTexturePlanes(GMM_TEXTURE_INFO *pTexInfo, uint32_t *pWidthBytesPhysical)
{
    GMM_STATUS               Status = GMM_SUCCESS;
    GMM_TEXTURE_INFO         TexInfoUVPlane;
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(pTexInfo->Flags.Info.RedecribedPlanes);
    __GMM_ASSERT(pWidthBytesPhysical);

    TexInfoUVPlane = *pTexInfo;
#ifdef _WIN32
    memcpy_s(&TexInfoUVPlane, sizeof(GMM_TEXTURE_INFO), pTexInfo, sizeof(GMM_TEXTURE_INFO));
#else
    memcpy(&TexInfoUVPlane, pTexInfo, sizeof(GMM_TEXTURE_INFO));
#endif // _WIN32


    if(GmmIsUVPacked(pTexInfo->Format))
    {
        // UV packed resources must have two seperate
        // tiling modes per plane, due to the packed
        // UV plane having twice the bits per pixel
        // as the Y plane.
        switch(pTexInfo->Format)
        {
            case GMM_FORMAT_NV12:
            case GMM_FORMAT_NV21:
            case GMM_FORMAT_P208:
                TexInfoUVPlane.BitsPerPixel = 16; // Redescribe bpp to 16 from 8
                break;
            case GMM_FORMAT_P010:
            case GMM_FORMAT_P012:
            case GMM_FORMAT_P016:
            case GMM_FORMAT_P216:
                TexInfoUVPlane.BitsPerPixel = 32;
                break;
            default:
                GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
                Status = GMM_INVALIDPARAM;
                goto ERROR_CASE;
                break;
        }
    }
    else
    {
        // Non-UV packed surfaces, TileMode and bpp of each plane is same as that of pTexInfo
    }

    SetTileMode(&TexInfoUVPlane);
    *pWidthBytesPhysical = GFX_ALIGN(*pWidthBytesPhysical, pPlatform->TileInfo[TexInfoUVPlane.TileMode].LogicalTileWidth);

ERROR_CASE:
    return (Status == GMM_SUCCESS) ? true : false;
}